

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_type fs_with_suffix(char *path,char *new_suffix,char *result,size_type buffer_size)

{
  size_type sVar1;
  string_view local_78;
  string_view local_68;
  string local_58;
  __sv_type local_38;
  size_type local_28;
  size_type buffer_size_local;
  char *result_local;
  char *new_suffix_local;
  char *path_local;
  
  local_28 = buffer_size;
  buffer_size_local = (size_type)result;
  result_local = new_suffix;
  new_suffix_local = path;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,path);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,result_local);
  fs_with_suffix_abi_cxx11_(&local_58,local_68,local_78);
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  sVar1 = fs_str2char(local_38,(char *)buffer_size_local,local_28);
  std::__cxx11::string::~string((string *)&local_58);
  return sVar1;
}

Assistant:

std::string::size_type fs_with_suffix(const char* path, const char* new_suffix,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_with_suffix(path, new_suffix), result, buffer_size);
}